

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O3

void __thiscall
cbtIDebugDraw::drawBox(cbtIDebugDraw *this,cbtVector3 *bbMin,cbtVector3 *bbMax,cbtVector3 *color)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  cbtScalar local_50;
  undefined4 uStack_4c;
  cbtScalar local_48;
  undefined4 local_44;
  cbtScalar local_40;
  cbtScalar cStack_3c;
  cbtScalar local_38;
  undefined4 local_34;
  
  uVar1 = *(ulong *)bbMin->m_floats;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  local_40 = (cbtScalar)uVar1;
  cStack_3c = (cbtScalar)(uVar1 >> 0x20);
  local_48 = bbMin->m_floats[2];
  local_34 = 0;
  local_50 = bbMax->m_floats[0];
  uStack_4c = (cbtScalar)vextractps_avx(auVar2,1);
  local_44 = 0;
  local_38 = local_48;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50);
  uVar1 = *(ulong *)(bbMin->m_floats + 1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar1;
  cStack_3c = (cbtScalar)uVar1;
  local_38 = (cbtScalar)(uVar1 >> 0x20);
  local_34 = 0;
  local_50 = (cbtScalar)*(undefined8 *)bbMax->m_floats;
  uStack_4c = (cbtScalar)((ulong)*(undefined8 *)bbMax->m_floats >> 0x20);
  local_48 = (cbtScalar)vextractps_avx(auVar3,1);
  local_44 = 0;
  local_40 = local_50;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  uVar1 = *(ulong *)bbMax->m_floats;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1;
  local_40 = (cbtScalar)uVar1;
  cStack_3c = (cbtScalar)(uVar1 >> 0x20);
  local_48 = bbMin->m_floats[2];
  local_34 = 0;
  local_50 = bbMin->m_floats[0];
  uStack_4c = (cbtScalar)vextractps_avx(auVar4,1);
  local_44 = 0;
  local_38 = local_48;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  cStack_3c = bbMax->m_floats[1];
  local_48 = bbMin->m_floats[2];
  local_34 = 0;
  local_50 = (cbtScalar)*(undefined8 *)bbMin->m_floats;
  uStack_4c = (cbtScalar)((ulong)*(undefined8 *)bbMin->m_floats >> 0x20);
  local_44 = 0;
  local_40 = local_50;
  local_38 = local_48;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  local_40 = (cbtScalar)*(undefined8 *)bbMin->m_floats;
  cStack_3c = (cbtScalar)((ulong)*(undefined8 *)bbMin->m_floats >> 0x20);
  local_38 = bbMin->m_floats[2];
  local_34 = 0;
  local_48 = bbMax->m_floats[2];
  local_44 = 0;
  local_50 = local_40;
  uStack_4c = cStack_3c;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  local_50 = bbMax->m_floats[0];
  cStack_3c = (cbtScalar)*(undefined8 *)(bbMin->m_floats + 1);
  local_38 = (cbtScalar)((ulong)*(undefined8 *)(bbMin->m_floats + 1) >> 0x20);
  local_34 = 0;
  uStack_4c = cStack_3c;
  local_48 = bbMax->m_floats[2];
  local_44 = 0;
  local_40 = local_50;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  local_40 = (cbtScalar)*(undefined8 *)bbMax->m_floats;
  cStack_3c = (cbtScalar)((ulong)*(undefined8 *)bbMax->m_floats >> 0x20);
  local_38 = bbMin->m_floats[2];
  local_34 = 0;
  local_48 = bbMax->m_floats[2];
  local_44 = 0;
  local_50 = local_40;
  uStack_4c = cStack_3c;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  local_50 = bbMin->m_floats[0];
  local_38 = bbMin->m_floats[2];
  local_34 = 0;
  uStack_4c = (cbtScalar)*(undefined8 *)(bbMax->m_floats + 1);
  local_48 = (cbtScalar)((ulong)*(undefined8 *)(bbMax->m_floats + 1) >> 0x20);
  local_44 = 0;
  local_40 = local_50;
  cStack_3c = uStack_4c;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  uVar1 = *(ulong *)bbMin->m_floats;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1;
  local_40 = (cbtScalar)uVar1;
  cStack_3c = (cbtScalar)(uVar1 >> 0x20);
  local_48 = bbMax->m_floats[2];
  local_34 = 0;
  local_50 = bbMax->m_floats[0];
  uStack_4c = (cbtScalar)vextractps_avx(auVar5,1);
  local_44 = 0;
  local_38 = local_48;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  cStack_3c = bbMin->m_floats[1];
  local_48 = bbMax->m_floats[2];
  local_34 = 0;
  local_50 = (cbtScalar)*(undefined8 *)bbMax->m_floats;
  uStack_4c = (cbtScalar)((ulong)*(undefined8 *)bbMax->m_floats >> 0x20);
  local_44 = 0;
  local_40 = local_50;
  local_38 = local_48;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  uVar1 = *(ulong *)bbMax->m_floats;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1;
  local_40 = (cbtScalar)uVar1;
  cStack_3c = (cbtScalar)(uVar1 >> 0x20);
  local_48 = bbMax->m_floats[2];
  local_34 = 0;
  local_50 = bbMin->m_floats[0];
  uStack_4c = (cbtScalar)vextractps_avx(auVar6,1);
  local_44 = 0;
  local_38 = local_48;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  uVar1 = *(ulong *)(bbMax->m_floats + 1);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar1;
  cStack_3c = (cbtScalar)uVar1;
  local_38 = (cbtScalar)(uVar1 >> 0x20);
  local_34 = 0;
  local_50 = (cbtScalar)*(undefined8 *)bbMin->m_floats;
  uStack_4c = (cbtScalar)((ulong)*(undefined8 *)bbMin->m_floats >> 0x20);
  local_48 = (cbtScalar)vextractps_avx(auVar7,1);
  local_40 = local_50;
  local_44 = 0;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  return;
}

Assistant:

virtual void drawBox(const cbtVector3& bbMin, const cbtVector3& bbMax, const cbtVector3& color)
	{
		drawLine(cbtVector3(bbMin[0], bbMin[1], bbMin[2]), cbtVector3(bbMax[0], bbMin[1], bbMin[2]), color);
		drawLine(cbtVector3(bbMax[0], bbMin[1], bbMin[2]), cbtVector3(bbMax[0], bbMax[1], bbMin[2]), color);
		drawLine(cbtVector3(bbMax[0], bbMax[1], bbMin[2]), cbtVector3(bbMin[0], bbMax[1], bbMin[2]), color);
		drawLine(cbtVector3(bbMin[0], bbMax[1], bbMin[2]), cbtVector3(bbMin[0], bbMin[1], bbMin[2]), color);
		drawLine(cbtVector3(bbMin[0], bbMin[1], bbMin[2]), cbtVector3(bbMin[0], bbMin[1], bbMax[2]), color);
		drawLine(cbtVector3(bbMax[0], bbMin[1], bbMin[2]), cbtVector3(bbMax[0], bbMin[1], bbMax[2]), color);
		drawLine(cbtVector3(bbMax[0], bbMax[1], bbMin[2]), cbtVector3(bbMax[0], bbMax[1], bbMax[2]), color);
		drawLine(cbtVector3(bbMin[0], bbMax[1], bbMin[2]), cbtVector3(bbMin[0], bbMax[1], bbMax[2]), color);
		drawLine(cbtVector3(bbMin[0], bbMin[1], bbMax[2]), cbtVector3(bbMax[0], bbMin[1], bbMax[2]), color);
		drawLine(cbtVector3(bbMax[0], bbMin[1], bbMax[2]), cbtVector3(bbMax[0], bbMax[1], bbMax[2]), color);
		drawLine(cbtVector3(bbMax[0], bbMax[1], bbMax[2]), cbtVector3(bbMin[0], bbMax[1], bbMax[2]), color);
		drawLine(cbtVector3(bbMin[0], bbMax[1], bbMax[2]), cbtVector3(bbMin[0], bbMin[1], bbMax[2]), color);
	}